

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ban.c
# Opt level: O2

void do_unban(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  char *txt;
  
  if (*argument == '\0') {
    txt = "Remove which site from the ban list?\n\r";
  }
  else {
    iVar1 = CSQLInterface::Delete(&RS.SQL,"bans WHERE site LIKE \'%%%s%%\'",argument);
    txt = "Site unbanned.\n\r";
    if (iVar1 == 0) {
      txt = "Site is not banned.\n\r";
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_unban(CHAR_DATA *ch, char *argument)
{
	if (argument[0] == '\0')
	{
		send_to_char("Remove which site from the ban list?\n\r", ch);
		return;
	}

	auto res = RS.SQL.Delete("bans WHERE site LIKE \'%%%s%%\'", argument);
	if (res)
		send_to_char("Site unbanned.\n\r", ch);
	else
		send_to_char("Site is not banned.\n\r", ch);
}